

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_ext.cpp
# Opt level: O0

void cs_impl::list_cs_ext::sort(list *lst,var *func)

{
  list<cs_impl::any,_std::allocator<cs_impl::any>_> *in_stack_000006c8;
  anon_class_8_1_898bcfc2 in_stack_000006d0;
  
  std::__cxx11::list<cs_impl::any,std::allocator<cs_impl::any>>::
  sort<cs_impl::list_cs_ext::sort(std::__cxx11::list<cs_impl::any,std::allocator<cs_impl::any>>&,cs_impl::any_const&)::__0>
            (in_stack_000006c8,in_stack_000006d0);
  return;
}

Assistant:

void sort(list &lst, const var &func)
		{
			lst.sort([&](const var &lhs, const var &rhs) -> bool {
				return invoke(func, lhs, rhs).const_val<boolean>();
			});
		}